

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void * __thiscall vector<Edge>::realloc(vector<Edge> *this,void *__ptr,size_t __size)

{
  int iVar1;
  Edge *in_RAX;
  ulong *puVar2;
  Edge *extraout_RAX;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar4 = 1;
  if (1 < (int)(uint)__ptr) {
    uVar4 = (uint)__ptr;
  }
  if (this->_capacity != uVar4) {
    uVar5 = (ulong)uVar4;
    puVar2 = (ulong *)operator_new__(uVar5 * 0xc + 8);
    *puVar2 = uVar5;
    in_RAX = (Edge *)memset((Edge *)(puVar2 + 1),0,((uVar5 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
    iVar1 = this->_size;
    if (0 < (long)iVar1) {
      in_RAX = this->vect;
      lVar3 = 0;
      do {
        *(undefined4 *)((long)puVar2 + lVar3 + 8) = *(undefined4 *)((long)&in_RAX->_nodeS + lVar3);
        *(undefined4 *)((long)puVar2 + lVar3 + 0xc) = *(undefined4 *)((long)&in_RAX->_nodeD + lVar3)
        ;
        *(undefined4 *)((long)puVar2 + lVar3 + 0x10) = *(undefined4 *)((long)&in_RAX->_cost + lVar3)
        ;
        lVar3 = lVar3 + 0xc;
      } while ((long)iVar1 * 0xc != lVar3);
    }
    this->_capacity = uVar4;
    if (this->vect != (Edge *)0x0) {
      operator_delete__(&this->vect[-1]._nodeD);
      in_RAX = extraout_RAX;
    }
    this->vect = (Edge *)(puVar2 + 1);
  }
  return in_RAX;
}

Assistant:

inline T max(const T& a, const T& b) {
    return (a < b) ? b : a;
}